

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::WorldCoordinates::Decode(WorldCoordinates *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x17 < KVar1) {
    KDataStream::Read<double>(stream,(double *)&this->m_f64X);
    KDataStream::Read<double>(stream,(double *)&this->m_f64Y);
    KDataStream::Read<double>(stream,(double *)&this->m_f64Z);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void WorldCoordinates::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < WORLD_COORDINATES_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f64X
           >> m_f64Y
           >> m_f64Z;
}